

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoxObjectiveFunction.cpp
# Opt level: O2

int __thiscall
OpenMD::BoxObjectiveFunction::setCoor
          (BoxObjectiveFunction *this,DynamicVector<double,_std::allocator<double>_> *x)

{
  Mat3x3d *m;
  pointer pdVar1;
  int iVar2;
  Molecule *this_00;
  long lVar3;
  RectMatrix<double,_3U,_3U> *m_00;
  double dVar4;
  double local_2d8;
  MoleculeIterator miter;
  Vector3d delta;
  Vector3d posN;
  Vector3d posO;
  Mat3x3d Hmat;
  RectMatrix<double,_3U,_3U> local_228;
  RectMatrix<double,_3U,_3U> local_1e0;
  Mat3x3d eps;
  Mat3x3d test;
  RectMatrix<double,_3U,_3U> local_108;
  RectMatrix<double,_3U,_3U> local_c0;
  Mat3x3d y;
  
  Vector<double,_3U>::Vector(&posO.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&posN.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&delta.super_Vector<double,_3U>);
  miter._M_node = (_Base_ptr)0x0;
  RectMatrix<double,_3U,_3U>::RectMatrix(&local_108,0.0);
  RectMatrix<double,_3U,_3U>::RectMatrix((RectMatrix<double,_3U,_3U> *)&eps,0.0);
  RectMatrix<double,_3U,_3U>::RectMatrix((RectMatrix<double,_3U,_3U> *)&y,0.0);
  RectMatrix<double,_3U,_3U>::RectMatrix((RectMatrix<double,_3U,_3U> *)&test,0.0);
  pdVar1 = (x->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_108.data_[0][0] = *pdVar1;
  local_108.data_[1][1] = pdVar1[1];
  local_108.data_[2][2] = pdVar1[2];
  local_108.data_[1][2] = pdVar1[3] * 0.5;
  local_108.data_[0][2] = pdVar1[4] * 0.5;
  local_108.data_[0][1] = pdVar1[5] * 0.5;
  local_108.data_[1][0] = local_108.data_[0][1];
  local_108.data_[2][0] = local_108.data_[0][2];
  local_108.data_[2][1] = local_108.data_[1][2];
  dVar4 = RectMatrix<double,_3U,_3U>::frobeniusNorm(&local_108);
  if (dVar4 <= 0.7) {
    local_2d8 = 1.0;
    m_00 = &local_108;
    while( true ) {
      RectMatrix<double,_3U,_3U>::operator=((RectMatrix<double,_3U,_3U> *)&eps,m_00);
      if (local_2d8 <= 1e-10) break;
      operator*((SquareMatrix3<double> *)&local_c0,(SquareMatrix3<double> *)&eps,
                (SquareMatrix3<double> *)&eps);
      operator/(&local_1e0,&local_c0,2.0);
      operator-(&local_228,&local_108,&local_1e0);
      RectMatrix<double,_3U,_3U>::operator=((RectMatrix<double,_3U,_3U> *)&Hmat,&local_228);
      SquareMatrix3<double>::operator=((SquareMatrix3<double> *)&y,(SquareMatrix<double,_3> *)&Hmat)
      ;
      operator-(&local_228,(RectMatrix<double,_3U,_3U> *)&y,(RectMatrix<double,_3U,_3U> *)&eps);
      RectMatrix<double,_3U,_3U>::operator=((RectMatrix<double,_3U,_3U> *)&Hmat,&local_228);
      SquareMatrix3<double>::operator=
                ((SquareMatrix3<double> *)&test,(SquareMatrix<double,_3> *)&Hmat);
      local_2d8 = RectMatrix<double,_3U,_3U>::frobeniusNorm((RectMatrix<double,_3U,_3U> *)&test);
      m_00 = (RectMatrix<double,_3U,_3U> *)&y;
    }
    SquareMatrix<double,_3>::identity();
    OpenMD::operator+(&local_228,&local_1e0,(RectMatrix<double,_3U,_3U> *)&eps);
    RectMatrix<double,_3U,_3U>::operator=((RectMatrix<double,_3U,_3U> *)&Hmat,&local_228);
    m = &this->deformation_;
    SquareMatrix3<double>::operator=(m,(SquareMatrix<double,_3> *)&Hmat);
    this_00 = SimInfo::beginMolecule(this->info_,&miter);
    lVar3 = 0;
    while (this_00 != (Molecule *)0x0) {
      Vector<double,_3U>::operator=
                (&posO.super_Vector<double,_3U>,
                 (Vector<double,_3U> *)
                 ((long)(((this->refPos_).
                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->super_Vector<double,_3U>).
                        data_ + lVar3));
      Molecule::getCom((Vector3d *)&Hmat,this_00);
      Vector<double,_3U>::operator=(&posN.super_Vector<double,_3U>,(Vector<double,_3U> *)&Hmat);
      operator*((Vector<double,_3U> *)&local_228,(RectMatrix<double,_3U,_3U> *)m,
                &posO.super_Vector<double,_3U>);
      operator-((Vector<double,_3U> *)&Hmat,(Vector<double,_3U> *)&local_228,
                &posN.super_Vector<double,_3U>);
      Vector3<double>::operator=(&delta,(Vector<double,_3U> *)&Hmat);
      Molecule::moveCom(this_00,&delta);
      this_00 = SimInfo::nextMolecule(this->info_,&miter);
      lVar3 = lVar3 + 0x18;
    }
    operator*(&Hmat,m,&this->refHmat_);
    Snapshot::setHmat(this->info_->sman_->currentSnapshot_,&Hmat);
    iVar2 = 0;
  }
  else {
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int BoxObjectiveFunction::setCoor(const DynamicVector<RealType>& x) {
    Vector3d posO;
    Vector3d posN;
    Vector3d delta;
    SimInfo::MoleculeIterator miter;
    Molecule* mol;
    Mat3x3d eta(0.0);
    Mat3x3d eps(0.0);
    Mat3x3d y(0.0);
    Mat3x3d test(0.0);
    RealType norm;

    // η is the Lagrangian strain tensor:
    eta.setupVoigtTensor(x[0], x[1], x[2], x[3] / 2., x[4] / 2., x[5] / 2.);

    // Make sure the deformation isn't too large:
    if (eta.frobeniusNorm() > 0.7) {
      // Deformation is too large, return an error condition:
      return -1;
    }

    // Find the physical strain tensor, ε, from the Lagrangian strain, η:
    // η = ε + 0.5 * ε^2
    norm = 1.0;
    eps  = eta;
    while (norm > 1.0e-10) {
      y    = eta - eps * eps / 2.0;
      test = y - eps;
      norm = test.frobeniusNorm();
      eps  = y;
    }
    deformation_ = SquareMatrix3<RealType>::identity() + eps;

    int index = 0;

    for (mol = info_->beginMolecule(miter); mol != NULL;
         mol = info_->nextMolecule(miter)) {
      posO  = refPos_[index++];
      posN  = mol->getCom();
      delta = deformation_ * posO - posN;
      mol->moveCom(delta);
    }

    Mat3x3d Hmat = deformation_ * refHmat_;
    info_->getSnapshotManager()->getCurrentSnapshot()->setHmat(Hmat);
    return 0;
  }